

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  undefined2 in_stack_ffffffffffffff88;
  uint uVar4;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression((CompilerGLSL *)__return_storage_ptr__,exp_str);
  bVar1 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (bVar1) {
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x314719,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,ts_2);
  }
  else {
    lVar3 = ::std::__cxx11::string::rfind((char)exp_str,0x5b);
    if (lVar3 == -1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)exp_str);
    }
    else {
      ::std::__cxx11::string::substr((ulong)&column_expr,(ulong)exp_str);
      ::std::__cxx11::string::resize((ulong)exp_str);
      type_to_glsl_constructor_abi_cxx11_(&local_70,this,exp_type);
      ::std::operator+(__return_storage_ptr__,&local_70,"(");
      ::std::__cxx11::string::~string((string *)&local_70);
      uVar2 = 0;
      while (uVar2 < exp_type->vecsize) {
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  (&local_70,(spirv_cross *)exp_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff8b,&stack0xffffffffffffff8c,
                   (uint *)&stack0xffffffffffffff8a,(char *)&column_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar2,CONCAT13(0x5b,CONCAT12(0x5d,in_stack_ffffffffffffff88))));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        uVar4 = uVar2;
        ::std::__cxx11::string::~string((string *)&local_70);
        uVar2 = uVar4 + 1;
        if (uVar2 < exp_type->vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar2 = uVar4 + 1;
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&column_expr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else
		return join("transpose(", exp_str, ")");
}